

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O2

void __thiscall CVmDbgFrameSymPtr::inc(CVmDbgFrameSymPtr *this)

{
  uint uVar1;
  uchar *puVar2;
  
  if ((this->p_[2] & 4) == 0) {
    uVar1 = get_sym_len(this);
    puVar2 = this->p_ + (uVar1 + 2);
  }
  else {
    puVar2 = this->p_ + 4;
  }
  this->p_ = puVar2;
  this->p_ = puVar2 + G_dbg_lclsym_hdr_size_X;
  return;
}

Assistant:

void inc(VMG0_)
    {
        /* skip the in-line symbol, or the pointer */
        if (is_sym_inline())
            p_ += get_sym_len(vmg0_) + 2;
        else
            p_ += 4;

        /* skip the header */
        p_ += G_dbg_lclsym_hdr_size;
    }